

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Attribute_PDU.cpp
# Opt level: O3

KString * __thiscall
KDIS::PDU::Attribute_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Attribute_PDU *this)

{
  pointer pAVar1;
  KString *pKVar2;
  ostream *poVar3;
  KCHAR8 in_CL;
  KUINT16 Tabs;
  KUINT16 Tabs_00;
  KINT32 Value;
  KINT32 Value_00;
  KINT32 Value_01;
  KINT32 Value_02;
  pointer pAVar4;
  KStringStream ss;
  KString local_2a0;
  KString local_280;
  KString *local_260;
  KString local_258;
  KString local_238;
  KString local_218;
  KString local_1f8;
  KString local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  Header7::GetAsString_abi_cxx11_(&local_2a0,&this->super_Header);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,local_2a0._M_dataplus._M_p,local_2a0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"-Attribute PDU-\n",0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"Originating Simulation Address:\n",0x20);
  DATA_TYPE::SimulationIdentifier::GetAsString_abi_cxx11_(&local_1d8,&this->m_OrigSimAddr);
  UTILS::IndentString(&local_280,&local_1d8,Tabs,in_CL);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_280._M_dataplus._M_p,local_280._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Extended PDU Type:  ",0x14);
  DATA_TYPE::ENUMS::GetEnumAsStringPDUType_abi_cxx11_
            (&local_1f8,(ENUMS *)(ulong)this->m_ui8ExtPDUType,Value);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Protocol Version:   ",0x14);
  DATA_TYPE::ENUMS::GetEnumAsStringProtocolVersion_abi_cxx11_
            (&local_218,(ENUMS *)(ulong)this->m_ui8ExtProtocolVersion,Value_00);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_218._M_dataplus._M_p,local_218._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Master Record Type: ",0x14);
  DATA_TYPE::ENUMS::GetEnumAsStringAttributeID_abi_cxx11_
            (&local_238,(ENUMS *)(ulong)this->m_ui32MasterRecType,Value_01);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_238._M_dataplus._M_p,local_238._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Action Code:        ",0x14);
  DATA_TYPE::ENUMS::GetEnumAsStringActionCode_abi_cxx11_
            (&local_258,(ENUMS *)(ulong)this->m_ui8ActionCode,Value_02);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_258._M_dataplus._M_p,local_258._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Number Of Records:  ",0x14);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Record Sets:\n",0xd);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2) {
    operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
  }
  local_260 = __return_storage_ptr__;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
    operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
  }
  pAVar4 = (this->m_vAttributeRecordSets).
           super__Vector_base<KDIS::DATA_TYPE::AttributeRecordSet,_std::allocator<KDIS::DATA_TYPE::AttributeRecordSet>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pAVar1 = (this->m_vAttributeRecordSets).
           super__Vector_base<KDIS::DATA_TYPE::AttributeRecordSet,_std::allocator<KDIS::DATA_TYPE::AttributeRecordSet>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pAVar4 != pAVar1) {
    do {
      (*(pAVar4->super_DataTypeBase)._vptr_DataTypeBase[2])(&local_280,pAVar4);
      UTILS::IndentString(&local_2a0,&local_280,Tabs_00,in_CL);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,local_2a0._M_dataplus._M_p,local_2a0._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
        operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_280._M_dataplus._M_p != &local_280.field_2) {
        operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
      }
      pAVar4 = pAVar4 + 1;
    } while (pAVar4 != pAVar1);
  }
  pKVar2 = local_260;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return pKVar2;
}

Assistant:

KString Attribute_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Attribute PDU-\n"
       << "Originating Simulation Address:\n"
       << IndentString( m_OrigSimAddr.GetAsString(), 1 )
       << "Extended PDU Type:  " << GetEnumAsStringPDUType( m_ui8ExtPDUType )                 << "\n"
       << "Protocol Version:   " << GetEnumAsStringProtocolVersion( m_ui8ExtProtocolVersion ) << "\n"
       << "Master Record Type: " << GetEnumAsStringAttributeID( m_ui32MasterRecType )         << "\n"
       << "Action Code:        " << GetEnumAsStringActionCode( m_ui8ActionCode )              << "\n"
       << "Number Of Records:  " << m_ui16NumAttrRecSets                                      << "\n"
       << "Record Sets:\n";

    vector<AttributeRecordSet>::const_iterator citr = m_vAttributeRecordSets.begin();
    vector<AttributeRecordSet>::const_iterator citrEnd = m_vAttributeRecordSets.end();
    for( ; citr != citrEnd; ++citr )
    {
        ss << IndentString( citr->GetAsString(), 1 );
    }

    return ss.str();
}